

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

Gia_Obj_t * Cbs_ManDecideMaxFF(Cbs_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_28;
  int iCurFF;
  int iMaxFF;
  int i;
  Gia_Obj_t *pObjMax;
  Gia_Obj_t *pObj;
  Cbs_Man_t *p_local;
  
  _iMaxFF = (Gia_Obj_t *)0x0;
  local_28 = 0;
  if (p->pAig->pRefs == (int *)0x0) {
    __assert_fail("p->pAig->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x1c7,"Gia_Obj_t *Cbs_ManDecideMaxFF(Cbs_Man_t *)");
  }
  iCurFF = (p->pJust).iHead;
  while( true ) {
    bVar2 = false;
    if (iCurFF < (p->pJust).iTail) {
      pObjMax = (p->pJust).pData[iCurFF];
      bVar2 = pObjMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Cbs_VarFaninFanoutMax(p,pObjMax);
    if (iVar1 < 1) {
      __assert_fail("iCurFF > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                    ,0x1cb,"Gia_Obj_t *Cbs_ManDecideMaxFF(Cbs_Man_t *)");
    }
    if (local_28 < iVar1) {
      _iMaxFF = pObjMax;
      local_28 = iVar1;
    }
    iCurFF = iCurFF + 1;
  }
  return _iMaxFF;
}

Assistant:

static inline Gia_Obj_t * Cbs_ManDecideMaxFF( Cbs_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjMax = NULL;
    int i, iMaxFF = 0, iCurFF;
    assert( p->pAig->pRefs != NULL );
    Cbs_QueForEachEntry( p->pJust, pObj, i )
    {
        iCurFF = Cbs_VarFaninFanoutMax( p, pObj );
        assert( iCurFF > 0 );
        if ( iMaxFF < iCurFF )
        {
            iMaxFF = iCurFF;
            pObjMax = pObj;
        }
    }
    return pObjMax; 
}